

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t _elemsize;
  _func_int *p_Var6;
  Layer *pLVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int _c;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int _w;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int _w_00;
  ulong uVar19;
  int i;
  ulong uVar20;
  long lVar21;
  void *pvVar22;
  undefined4 *puVar23;
  long lVar24;
  undefined4 *local_228;
  long local_208;
  long local_1d0;
  long local_1a8;
  long local_1a0;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Mat local_c0;
  Option opt_g;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var6 = this->_vptr_Convolution_x86[-3];
  iVar3 = *(int *)(p_Var6 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
  iVar4 = *(int *)(p_Var6 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar5 = *(uint *)(p_Var6 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
  iVar18 = (iVar3 + -1) * uVar5 + 1;
  iVar8 = (iVar1 - iVar18) / iVar4;
  _w = iVar8 + 1;
  Mat::create(top_blob,_w,(iVar2 - iVar18) / iVar4 + 1,
              *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data),_elemsize,
              opt->blob_allocator);
  iVar18 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    inner_bottom_blob.cstep = 0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount._0_4_ = 0;
    inner_bottom_blob.refcount._4_4_ = 0;
    inner_bottom_blob.elemsize._0_4_ = 0;
    inner_bottom_blob._20_8_ = 0;
    inner_top_blob.cstep = 0;
    inner_bottom_blob.allocator = (Allocator *)0x0;
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.h = 0;
    inner_bottom_blob.d = 0;
    inner_bottom_blob.c = 0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount._0_4_ = 0;
    inner_top_blob.refcount._4_4_ = 0;
    inner_top_blob.elemsize._0_4_ = 0;
    inner_top_blob._20_8_ = 0;
    inner_top_blob.allocator = (Allocator *)0x0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.h = 0;
    inner_top_blob.d = 0;
    inner_top_blob.c = 0;
    local_1d0 = 0;
    uVar19 = 0;
    if (0 < (int)uVar5) {
      uVar19 = (ulong)uVar5;
    }
    local_208 = 0;
    for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
      local_1a8 = local_1d0;
      local_1a0 = local_208;
      for (uVar13 = 0; uVar13 != uVar5; uVar13 = uVar13 + 1) {
        uVar17 = (long)(int)(((uVar5 - 1) + iVar1) - (int)uVar13) / (long)(int)uVar5;
        uVar20 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar12) / (long)(int)uVar5;
        uVar15 = uVar20 & 0xffffffff;
        iVar16 = (int)uVar17;
        iVar18 = (iVar16 - iVar3) / iVar4;
        iVar14 = (int)uVar20;
        iVar9 = (iVar14 - iVar3) / iVar4;
        Mat::create(&inner_bottom_blob,iVar16,iVar14,bottom_blob->c,_elemsize,
                    opt->workspace_allocator);
        if ((inner_bottom_blob.data == (void *)0x0) ||
           ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) {
LAB_0016a1f1:
          iVar18 = -100;
          goto LAB_0016a1f5;
        }
        _w_00 = iVar18 + 1;
        Mat::create(&inner_top_blob,_w_00,iVar9 + 1,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),_elemsize,
                    opt->workspace_allocator);
        if ((inner_top_blob.data == (void *)0x0) ||
           ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_0016a1f1;
        _c = 0;
        uVar17 = uVar17 & 0xffffffff;
        if (iVar16 < 1) {
          uVar17 = 0;
        }
        if (iVar14 < 1) {
          uVar15 = 0;
        }
        for (; _c < bottom_blob->c; _c = _c + 1) {
          Mat::channel(&local_c0,&inner_bottom_blob,_c);
          pvVar22 = local_c0.data;
          Mat::~Mat(&local_c0);
          iVar14 = 0;
          for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
            Mat::channel(&local_c0,bottom_blob,_c);
            puVar23 = (undefined4 *)((long)local_c0.data + (long)iVar14 * 4 + local_1a0);
            Mat::~Mat(&local_c0);
            for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
              *(undefined4 *)((long)pvVar22 + uVar10 * 4) = *puVar23;
              puVar23 = puVar23 + (int)uVar5;
            }
            pvVar22 = (void *)((long)pvVar22 + (long)iVar16 * 4);
            iVar14 = iVar14 + uVar5 * iVar1;
          }
        }
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
        opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_weight_fp16_storage = opt->use_weight_fp16_storage;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_reserved_1 = opt->use_reserved_1;
        opt_g.use_reserved_2 = opt->use_reserved_2;
        opt_g.use_reserved_3 = opt->use_reserved_3;
        opt_g.use_reserved_4 = opt->use_reserved_4;
        opt_g.use_reserved_5 = opt->use_reserved_5;
        opt_g.use_reserved_6 = opt->use_reserved_6;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = inner_top_blob.allocator;
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&inner_bottom_blob,&inner_top_blob,&opt_g);
        for (iVar16 = 0;
            iVar16 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                             (long)&(this->weight_data_3x3_winograd63).data); iVar16 = iVar16 + 1) {
          Mat::channel(&local_c0,top_blob,iVar16);
          local_228 = (undefined4 *)((long)local_c0.data + local_1a8);
          Mat::~Mat(&local_c0);
          lVar24 = 0;
          for (lVar21 = 0; lVar21 <= iVar9; lVar21 = lVar21 + 1) {
            Mat::channel(&local_c0,&inner_top_blob,iVar16);
            pvVar22 = local_c0.data;
            Mat::~Mat(&local_c0);
            puVar23 = local_228;
            for (lVar11 = 0; lVar11 <= iVar18; lVar11 = lVar11 + 1) {
              *puVar23 = *(undefined4 *)((long)pvVar22 + lVar11 * 4 + lVar24);
              puVar23 = puVar23 + (int)uVar5;
            }
            lVar24 = lVar24 + (long)_w_00 * 4;
            local_228 = local_228 + (int)(_w * uVar5);
          }
        }
        local_1a0 = local_1a0 + 4;
        local_1a8 = local_1a8 + 4;
      }
      local_208 = local_208 + (long)iVar1 * 4;
      local_1d0 = local_1d0 + (long)iVar8 * 4 + 4;
    }
    pLVar7 = this->activation;
    iVar18 = 0;
    if (pLVar7 != (Layer *)0x0) {
      (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
    }
LAB_0016a1f5:
    Mat::~Mat(&inner_top_blob);
    Mat::~Mat(&inner_bottom_blob);
  }
  return iVar18;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}